

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *pCtx;
  undefined8 in_RDI;
  int iVal;
  uchar *z;
  
  iVal = (int)((ulong)in_RDI >> 0x20);
  pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x1dbb7f);
  if ((pCtx != (sqlite3_context *)0x0) && (*(uchar *)&pCtx->pOut != '\0')) {
    sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe0);
    sqlite3_result_int(pCtx,iVal);
  }
  return;
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}